

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

PlainTextNetworkReader * __thiscall
notch::io::PlainTextNetworkReader::read_value<std::__cxx11::string>
          (PlainTextNetworkReader *this,istream *in,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  istream *piVar1;
  string *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  istream *in_local;
  PlainTextNetworkReader *this_local;
  
  piVar1 = (istream *)std::istream::operator>>(value,std::ws<char,std::char_traits<char>>);
  piVar1 = std::operator>>(piVar1,in_RCX);
  std::istream::operator>>(piVar1,std::ws<char,std::char_traits<char>>);
  std::__cxx11::string::string((string *)this,in_RCX);
  return this;
}

Assistant:

T
    read_value(std::istream &in, T &value) {
       in >> std::ws >> value >> std::ws;
       return value;
    }